

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

Index __thiscall
MADPComponentDiscreteObservations::IndividualToJointObservationIndices
          (MADPComponentDiscreteObservations *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivObservationIndices)

{
  Index IVar1;
  undefined8 *puVar2;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_m_initialized != false) {
    IVar1 = IndexTools::IndividualToJointIndicesStepSize
                      (indivObservationIndices,this->_m_observationStepSize);
    return IVar1;
  }
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"MADPComponentDiscreteObservations::GetJointObservationIndex(",0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"vector<Index>& indivObservationIndices) - Error: not initialized.",0x41);
  std::endl<char,std::char_traits<char>>(local_188);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteObservations::IndividualToJointObservationIndices(
    const vector<Index>& indivObservationIndices)const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss <<  "MADPComponentDiscreteObservations::GetJointObservationIndex("<<
           "vector<Index>& indivObservationIndices) - Error: not initialized."
            <<endl;
        throw E(ss);
    }
    Index i = IndexTools::IndividualToJointIndicesStepSize(
            indivObservationIndices, _m_observationStepSize);

    return(i);
}